

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  Arena *pAVar1;
  Extension *pEVar2;
  MessageLite *pMVar3;
  ExtensionSet *const_this;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  if (pEVar2->is_repeated == false) {
    if (0xed < (byte)(pEVar2->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4) == 10) {
        if ((pEVar2->field_0xa & 4) == 0) {
          pMVar3 = (MessageLite *)(pEVar2->field_0).int64_t_value;
        }
        else {
          pAVar1 = this->arena_;
          pMVar3 = (MessageLite *)
                   (**(code **)(**(long **)&(pEVar2->field_0).int32_t_value + 0x48))
                             (*(long **)&(pEVar2->field_0).int32_t_value,prototype,pAVar1);
          if ((pAVar1 == (Arena *)0x0) && ((long *)(pEVar2->field_0).int64_t_value != (long *)0x0))
          {
            (**(code **)(*(long *)(pEVar2->field_0).int64_t_value + 8))();
          }
        }
        Erase(this,number);
        return pMVar3;
      }
      goto LAB_001d371c;
    }
  }
  else {
    UnsafeArenaReleaseMessage((ExtensionSet *)&stack0xffffffffffffffc8);
  }
  UnsafeArenaReleaseMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_001d371c:
  UnsafeArenaReleaseMessage();
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    int number, const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->UnsafeArenaReleaseMessage(
          prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      ret = extension->ptr.message_value;
    }
    Erase(number);
    return ret;
  }
}